

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O2

cmFileLockResult __thiscall cmFileLockPool::ScopePool::Release(ScopePool *this,string *filename)

{
  pointer pcVar1;
  bool bVar2;
  cmFileLockResult cVar3;
  pointer this_00;
  
  this_00 = (this->Locks).super__Vector_base<cmFileLock,_std::allocator<cmFileLock>_>._M_impl.
            super__Vector_impl_data._M_start;
  pcVar1 = (this->Locks).super__Vector_base<cmFileLock,_std::allocator<cmFileLock>_>._M_impl.
           super__Vector_impl_data._M_finish;
  while( true ) {
    if (this_00 == pcVar1) {
      cVar3 = cmFileLockResult::MakeOk();
      return cVar3;
    }
    bVar2 = cmFileLock::IsLocked(this_00,filename);
    if (bVar2) break;
    this_00 = this_00 + 1;
  }
  cVar3 = cmFileLock::Release(this_00);
  return cVar3;
}

Assistant:

cmFileLockResult cmFileLockPool::ScopePool::Release(
  const std::string& filename)
{
  for (auto& lock : this->Locks) {
    if (lock.IsLocked(filename)) {
      return lock.Release();
    }
  }
  return cmFileLockResult::MakeOk();
}